

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_is_leap.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* 1901 not leap */
    TESTCASE( ! _PDCLIB_is_leap( 1 ) );
    /* 1904 leap */
    TESTCASE( _PDCLIB_is_leap( 4 ) );
    /* 1900 not leap */
    TESTCASE( ! _PDCLIB_is_leap( 0 ) );
    /* 2000 leap */
    TESTCASE( _PDCLIB_is_leap( 100 ) );
#endif
    return TEST_RESULTS;
}